

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_obj.c
# Opt level: O0

void obj_dosettracing(t_object *ob,int onoff)

{
  t_pd p_Var1;
  t_pd *pp_Var2;
  t_backtracer *b_1;
  t_backtracer *b;
  _outlet *o;
  int onoff_local;
  t_object *ob_local;
  
  for (b = (t_backtracer *)ob->te_outlet; b != (t_backtracer *)0x0;
      b = (t_backtracer *)b->b_connections) {
    if (onoff == 0) {
      if ((b->b_owner == (t_pd *)0x0) || ((_class *)b->b_owner[1]->c_name != backtracer_class)) {
        bug("obj_dosettracing");
      }
      else {
        p_Var1 = b->b_owner[1];
        freebytes(b->b_owner,0x10);
        b->b_owner = (t_pd *)p_Var1->c_helpname;
        freebytes(p_Var1,0x18);
      }
    }
    else {
      p_Var1 = (t_pd)backtracer_new((t_pd *)ob);
      p_Var1->c_helpname = (t_symbol *)b->b_owner;
      pp_Var2 = (t_pd *)getbytes(0x10);
      b->b_owner = pp_Var2;
      *b->b_owner = (t_pd)0x0;
      b->b_owner[1] = p_Var1;
    }
  }
  return;
}

Assistant:

void obj_dosettracing(t_object *ob, int onoff)
{
    t_outlet *o;
    for (o = ob->ob_outlet; o; o = o->o_next)
    {
        if (onoff)
        {
            t_backtracer *b = backtracer_new(&ob->ob_pd);
            b->b_connections = o->o_connections;
            o->o_connections =  (t_outconnect *)t_getbytes(sizeof(t_outconnect));
            o->o_connections->oc_next = 0;
            o->o_connections->oc_to = &b->b_pd;
        }
        else if (o->o_connections &&
            (*o->o_connections->oc_to == backtracer_class))
        {
            t_backtracer *b = (t_backtracer *)o->o_connections->oc_to;
            t_freebytes(o->o_connections, sizeof(*o->o_connections));
            o->o_connections = b->b_connections;
            t_freebytes(b, sizeof(*b));
        }
        else bug("obj_dosettracing");
    }
}